

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

void API::insert_value(STMT *stmt)

{
  pointer pcVar1;
  TableInfo *pTVar2;
  pointer pvVar3;
  _Alloc_hider _Var4;
  Addr p_00;
  bool bVar5;
  int pos;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  _Self __tmp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Addr p;
  IndexInfo I;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined8 local_178;
  Addr local_170;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  _Alloc_hider local_98;
  char local_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<int,_std::allocator<int>_> *pvStack_48;
  vector<value,_std::allocator<value>_> *local_40;
  vector<condition,_std::allocator<condition>_> *pvStack_38;
  
  pcVar1 = (stmt->tableName)._M_dataplus._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + (stmt->tableName)._M_string_length);
  pos = catalog::existTable(&CM,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  bVar5 = checkInsert(stmt,pos);
  if (bVar5) {
    local_170.BlockNum = 0;
    local_170.FileOff = 0;
    local_78[0] = stmt->is_select_all;
    pcVar1 = (stmt->tableName)._M_dataplus._M_p;
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (stmt->tableName)._M_string_length);
    local_50 = stmt->colunmList;
    pvStack_48 = stmt->colunmId;
    local_40 = stmt->v_list;
    pvStack_38 = stmt->c_list;
    RecordManager::InsertSuchRecord(&RM,(STMT *)local_78,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    pTVar2 = CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start[pos];
    p_Var7 = (pTVar2->indexInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pTVar2->indexInfo)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var6) {
      paVar11 = &local_60;
      do {
        local_160._M_p = (pointer)&local_150;
        local_158 = 0;
        local_150._M_local_buf[0] = '\0';
        local_140._M_p = (pointer)&local_130;
        local_138 = 0;
        local_130._M_local_buf[0] = '\0';
        local_120._M_p = (pointer)&local_110;
        local_118 = 0;
        local_110._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)&local_140);
        std::__cxx11::string::_M_assign((string *)&local_160);
        local_168._4_4_ =
             (pTVar2->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color];
        local_e0._4_4_ = local_168._4_4_;
        local_e0._0_4_ = local_168._0_4_;
        local_d8._M_p = local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_160._M_p,local_160._M_p + local_158);
        local_b8._M_p = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_140._M_p,local_140._M_p + local_138);
        local_98._M_p = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_120._M_p,local_120._M_p + local_118);
        p_00 = local_170;
        uVar10 = (ulong)(int)p_Var7[1]._M_color;
        pvVar3 = (stmt->v_list->super__Vector_base<value,_std::allocator<value>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = ((long)(stmt->v_list->super__Vector_base<value,_std::allocator<value>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pvVar3 >> 4) * -0x5555555555555555;
        if (uVar9 < uVar10 || uVar9 - uVar10 == 0) {
          uVar8 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != paVar11) {
            operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar8);
        }
        local_1a0._0_4_ = pvVar3[uVar10].type;
        local_198._M_p = (pointer)&local_188;
        _Var4._M_p = pvVar3[uVar10].charV._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,_Var4._M_p,
                   _Var4._M_p + pvVar3[uVar10].charV._M_string_length);
        local_178._0_4_ = pvVar3[uVar10].intV;
        local_178._4_4_ = pvVar3[uVar10].floatV;
        IndexManager::InsertSuchKey(&IM,(IndexInfo *)local_e0,p_00,(value *)local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_p != &local_188) {
          operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
        }
        IndexInfo::~IndexInfo((IndexInfo *)local_e0);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        IndexInfo::~IndexInfo((IndexInfo *)local_168);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)stmt;
      } while ((_Rb_tree_header *)p_Var7 != p_Var6);
    }
    printStatement(stmt);
  }
  return;
}

Assistant:

void API::insert_value(STMT *stmt){
    int pos = CM.existTable(stmt->tableName);
    if(!checkInsert(stmt,pos))return;
    //检查无误
    Addr p = {0,0};
    RM.InsertSuchRecord(*stmt,p);
    TableInfo* T = CM.TableInfoList[pos];
    std::map<int,std::string>::iterator it;
    it = T->indexInfo.begin();
    while(it != T->indexInfo.end())
    {
        IndexInfo I;
        I.tableName = stmt->tableName;
        I.indexName = it->second;
        I.type = T->type[it->first];
        //插入B+树
        IM.InsertSuchKey(I,p,stmt->v_list->at(it->first));
        it ++;
    }
    printStatement(stmt);
}